

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_avx2.c
# Opt level: O0

void horver_correlation_4x4
               (int16_t *diff,int stride,__m256i *xy_sum_32,__m256i *xz_sum_32,__m256i *x_sum_32,
               __m256i *x2_sum_32)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  int in_ESI;
  void *in_RDI;
  undefined1 (*in_R8) [32];
  undefined1 (*in_R9) [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m256i madd_slli;
  __m256i madd1_slli;
  __m256i madd_xz;
  __m256i perm;
  __m256i madd_xy;
  __m256i slli;
  __m256i pixels;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar5 = loadu_int64(in_RDI);
  uVar6 = loadu_int64((void *)((long)in_RDI + (long)in_ESI * 2));
  uVar7 = loadu_int64((void *)((long)in_RDI + (long)(in_ESI * 2) * 2));
  uVar8 = loadu_int64((void *)((long)in_RDI + (long)(in_ESI * 3) * 2));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar8;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar7;
  auVar9 = vpunpcklqdq_avx(auVar9,auVar11);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar6;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar5;
  auVar11 = vpunpcklqdq_avx(auVar10,auVar12);
  uStack_310 = auVar11._0_8_;
  uStack_308 = auVar11._8_8_;
  auVar1._16_8_ = uStack_310;
  auVar1._0_16_ = auVar9;
  auVar1._24_8_ = uStack_308;
  auVar2 = vpsllq_avx2(auVar1,ZEXT416(0x10));
  auVar4._16_8_ = uStack_310;
  auVar4._0_16_ = auVar9;
  auVar4._24_8_ = uStack_308;
  auVar1 = vpmaddwd_avx2(auVar4,auVar2);
  auVar1 = vpaddd_avx2(*in_RDX,auVar1);
  *in_RDX = auVar1;
  auVar1 = vpermq_avx2(auVar2,0x90);
  auVar1 = vpmaddwd_avx2(auVar2,auVar1);
  auVar1 = vpaddd_avx2(*in_RCX,auVar1);
  *in_RCX = auVar1;
  auVar9 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar9 = vpinsrw_avx(auVar9,1,2);
  auVar9 = vpinsrw_avx(auVar9,1,3);
  auVar9 = vpinsrw_avx(auVar9,1,4);
  auVar9 = vpinsrw_avx(auVar9,1,5);
  auVar9 = vpinsrw_avx(auVar9,1,6);
  auVar9 = vpinsrw_avx(auVar9,1,7);
  auVar11 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar11 = vpinsrw_avx(auVar11,1,2);
  auVar11 = vpinsrw_avx(auVar11,1,3);
  auVar11 = vpinsrw_avx(auVar11,1,4);
  auVar11 = vpinsrw_avx(auVar11,1,5);
  auVar11 = vpinsrw_avx(auVar11,1,6);
  auVar11 = vpinsrw_avx(auVar11,1,7);
  auVar10 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar9;
  uStack_70 = auVar10._0_8_;
  uStack_68 = auVar10._8_8_;
  auVar3._16_8_ = uStack_70;
  auVar3._0_16_ = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar11;
  auVar3._24_8_ = uStack_68;
  auVar1 = vpmaddwd_avx2(auVar2,auVar3);
  auVar1 = vpaddd_avx2(*in_R8,auVar1);
  *in_R8 = auVar1;
  auVar1 = vpmaddwd_avx2(auVar2,auVar2);
  auVar1 = vpaddd_avx2(*in_R9,auVar1);
  *in_R9 = auVar1;
  return;
}

Assistant:

static inline void horver_correlation_4x4(const int16_t *diff, int stride,
                                          __m256i *xy_sum_32,
                                          __m256i *xz_sum_32, __m256i *x_sum_32,
                                          __m256i *x2_sum_32) {
  // Pixels in this 4x4   [ a b c d ]
  // are referred to as:  [ e f g h ]
  //                      [ i j k l ]
  //                      [ m n o p ]

  const __m256i pixels = _mm256_set_epi64x(
      loadu_int64(&diff[0 * stride]), loadu_int64(&diff[1 * stride]),
      loadu_int64(&diff[2 * stride]), loadu_int64(&diff[3 * stride]));
  // pixels = [d c b a h g f e] [l k j i p o n m] as i16

  const __m256i slli = _mm256_slli_epi64(pixels, 16);
  // slli = [c b a 0 g f e 0] [k j i 0 o n m 0] as i16

  const __m256i madd_xy = _mm256_madd_epi16(pixels, slli);
  // madd_xy = [bc+cd ab fg+gh ef] [jk+kl ij no+op mn] as i32
  *xy_sum_32 = _mm256_add_epi32(*xy_sum_32, madd_xy);

  // Permute control [3 2] [1 0] => [2 1] [0 0], 0b10010000 = 0x90
  const __m256i perm = _mm256_permute4x64_epi64(slli, 0x90);
  // perm = [g f e 0 k j i 0] [o n m 0 o n m 0] as i16

  const __m256i madd_xz = _mm256_madd_epi16(slli, perm);
  // madd_xz = [cg+bf ae gk+fj ei] [ko+jn im oo+nn mm] as i32
  *xz_sum_32 = _mm256_add_epi32(*xz_sum_32, madd_xz);

  // Sum every element in slli (and then also their squares)
  const __m256i madd1_slli = _mm256_madd_epi16(slli, _mm256_set1_epi16(1));
  // madd1_slli = [c+b a g+f e] [k+j i o+n m] as i32
  *x_sum_32 = _mm256_add_epi32(*x_sum_32, madd1_slli);

  const __m256i madd_slli = _mm256_madd_epi16(slli, slli);
  // madd_slli = [cc+bb aa gg+ff ee] [kk+jj ii oo+nn mm] as i32
  *x2_sum_32 = _mm256_add_epi32(*x2_sum_32, madd_slli);
}